

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O0

bool __thiscall
PruneReplayer::enqueue_create_graphics_pipeline
          (PruneReplayer *this,Hash hash,VkGraphicsPipelineCreateInfo *create_info,
          VkPipeline *pipeline)

{
  byte bVar1;
  VkPipeline *ppVVar2;
  bool bVar3;
  bool bVar4;
  VkPipeline_T *pVVar5;
  size_type sVar6;
  VkPipelineLibraryCreateInfoKHR *pVVar7;
  pointer ppVar8;
  mapped_type *ppVVar9;
  _Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
  local_70;
  VkPipeline local_68;
  _Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
  local_60;
  iterator itr;
  uint local_50;
  uint32_t i_2;
  bool has_default_allowed_library;
  VkPipelineLibraryCreateInfoKHR *library_info;
  uint local_34;
  uint local_30;
  uint32_t i_1;
  uint32_t i;
  bool allow_pipeline;
  VkPipeline *pipeline_local;
  VkGraphicsPipelineCreateInfo *create_info_local;
  Hash hash_local;
  PruneReplayer *this_local;
  
  _i = pipeline;
  pipeline_local = (VkPipeline *)create_info;
  create_info_local = (VkGraphicsPipelineCreateInfo *)hash;
  hash_local = (Hash)this;
  pVVar5 = fake_handle<VkPipeline_T*>(hash);
  *_i = pVVar5;
  i_1._3_1_ = 0;
  bVar3 = filter_object(this,RESOURCE_GRAPHICS_PIPELINE,(Hash)create_info_local);
  if (bVar3) {
    for (local_30 = 0; local_30 < *(uint *)((long)pipeline_local + 0x14); local_30 = local_30 + 1) {
      bVar3 = filter_shader_module
                        (this,*(Hash *)(pipeline_local[3] + (ulong)local_30 * 0x30 + 0x18));
      if (bVar3) {
        i_1._3_1_ = 1;
        break;
      }
    }
    if (*(int *)((long)pipeline_local + 0x14) == 0) {
      i_1._3_1_ = 1;
    }
    for (local_34 = 0; local_34 < *(uint *)((long)pipeline_local + 0x14); local_34 = local_34 + 1) {
      library_info = *(VkPipelineLibraryCreateInfoKHR **)
                      (pipeline_local[3] + (ulong)local_34 * 0x30 + 0x18);
      sVar6 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::count(&this->banned_modules,(key_type *)&library_info);
      if (sVar6 != 0) {
        i_1._3_1_ = 0;
        break;
      }
    }
    pVVar7 = find_pnext<VkPipelineLibraryCreateInfoKHR>
                       (VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR,pipeline_local[1]);
    if (pVVar7 != (VkPipelineLibraryCreateInfoKHR *)0x0) {
      bVar1 = 0;
      for (local_50 = 0; local_50 < pVVar7->libraryCount; local_50 = local_50 + 1) {
        itr.
        super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
        ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false>
                   )pVVar7->pLibraries[local_50];
        sVar6 = std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::count(&this->banned_graphics,(key_type *)&itr);
        if (sVar6 != 0) {
          i_1._3_1_ = 0;
          break;
        }
        if (bVar1 == 0) {
          local_68 = pVVar7->pLibraries[local_50];
          local_60._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_long,_const_VkGraphicsPipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>_>
               ::find(&this->graphics_pipelines,(key_type *)&local_68);
          local_70._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_long,_const_VkGraphicsPipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>_>
               ::end(&this->graphics_pipelines);
          bVar4 = std::__detail::operator!=(&local_60,&local_70);
          bVar3 = false;
          if (bVar4) {
            ppVar8 = std::__detail::
                     _Node_iterator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false,_false>
                     ::operator->((_Node_iterator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_false,_false>
                                   *)&local_60);
            bVar3 = ppVar8->second->stageCount != 0;
          }
          if (bVar3) {
            bVar1 = 1;
          }
        }
      }
      if ((*(int *)((long)pipeline_local + 0x14) == 0) && ((i_1._3_1_ & 1) != 0)) {
        i_1._3_1_ = bVar1;
      }
    }
    if ((((ulong)pipeline_local[2] & 0x800) != 0) && (*(int *)((long)pipeline_local + 0x14) == 0)) {
      i_1._3_1_ = 0;
    }
  }
  ppVVar2 = pipeline_local;
  if ((i_1._3_1_ & 1) == 0) {
    if (((ulong)pipeline_local[2] & 0x800) != 0) {
      ppVVar9 = std::
                unordered_map<unsigned_long,_const_VkGraphicsPipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>_>
                ::operator[](&this->library_graphics_pipelines,(key_type *)&create_info_local);
      *ppVVar9 = (mapped_type)ppVVar2;
    }
  }
  else {
    ppVVar9 = std::
              unordered_map<unsigned_long,_const_VkGraphicsPipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>_>
              ::operator[](&this->graphics_pipelines,(key_type *)&create_info_local);
    *ppVVar9 = (mapped_type)ppVVar2;
  }
  return true;
}

Assistant:

bool enqueue_create_graphics_pipeline(Hash hash, const VkGraphicsPipelineCreateInfo *create_info, VkPipeline *pipeline) override
	{
		*pipeline = fake_handle<VkPipeline>(hash);
		bool allow_pipeline = false;

		if (filter_object(RESOURCE_GRAPHICS_PIPELINE, hash))
		{
			for (uint32_t i = 0; i < create_info->stageCount; i++)
			{
				if (filter_shader_module((Hash) create_info->pStages[i].module))
				{
					allow_pipeline = true;
					break;
				}
			}

			if (create_info->stageCount == 0)
				allow_pipeline = true;

			// Need to test this as well, if there is at least one banned module used, we don't allow the pipeline.
			for (uint32_t i = 0; i < create_info->stageCount; i++)
			{
				if (banned_modules.count((Hash) create_info->pStages[i].module))
				{
					allow_pipeline = false;
					break;
				}
			}

			auto *library_info =
					find_pnext<VkPipelineLibraryCreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR,
					                                           create_info->pNext);

			if (library_info)
			{
				bool has_default_allowed_library = false;
				for (uint32_t i = 0; i < library_info->libraryCount; i++)
				{
					if (banned_graphics.count((Hash) library_info->pLibraries[i]))
					{
						allow_pipeline = false;
						break;
					}

					if (!has_default_allowed_library)
					{
						// Only consider libraries which contain modules.
						auto itr = graphics_pipelines.find((Hash) library_info->pLibraries[i]);
						if (itr != graphics_pipelines.end() && itr->second->stageCount != 0)
							has_default_allowed_library = true;
					}
				}

				// At least one of the dependent libraries must be considered allowed to pass.
				if (create_info->stageCount == 0 && allow_pipeline)
					allow_pipeline = has_default_allowed_library;
			}

			// Never include libraries by default unless they contain real code.
			if ((create_info->flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0 && create_info->stageCount == 0)
				allow_pipeline = false;
		}

		// Need to defer this since we need to access pipeline libraries.
		if (allow_pipeline)
			graphics_pipelines[hash] = create_info;
		else if ((create_info->flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0)
			library_graphics_pipelines[hash] = create_info;

		return true;
	}